

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O3

Reals __thiscall
Omega_h::clamp_metrics(Omega_h *this,LO nmetrics,Reals *metrics,Real h_min,Real h_max)

{
  int *piVar1;
  Int IVar2;
  void *pvVar3;
  void *extraout_RDX;
  Alloc *pAVar4;
  Reals RVar5;
  Reals local_70;
  Reals local_60;
  Reals local_50;
  Reals local_40;
  
  local_40.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.write_.shared_alloc_.alloc)->use_count =
           (local_40.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar4 = local_40.write_.shared_alloc_.alloc;
  local_40.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
  IVar2 = get_metrics_dim(nmetrics,&local_40);
  if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
    piVar1 = &pAVar4->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar4);
      operator_delete(pAVar4,0x48);
    }
  }
  if (IVar2 == 1) {
    local_70.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70.write_.shared_alloc_.alloc =
             (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_70.write_.shared_alloc_.alloc)->use_count =
             (local_70.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_70.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
    RVar5 = clamp_metrics_dim<1>(this,nmetrics,&local_70,h_min,h_max);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_70.write_.shared_alloc_.alloc;
  }
  else if (IVar2 == 2) {
    local_60.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.write_.shared_alloc_.alloc =
             (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_60.write_.shared_alloc_.alloc)->use_count =
             (local_60.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
    RVar5 = clamp_metrics_dim<2>(this,nmetrics,&local_60,h_min,h_max);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_60.write_.shared_alloc_.alloc;
  }
  else {
    if (IVar2 != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
           ,0x35);
    }
    local_50.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
    if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.write_.shared_alloc_.alloc =
             (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_50.write_.shared_alloc_.alloc)->use_count =
             (local_50.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
    RVar5 = clamp_metrics_dim<3>(this,nmetrics,&local_50,h_min,h_max);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_50.write_.shared_alloc_.alloc;
  }
  if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
    piVar1 = &pAVar4->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar4);
      operator_delete(pAVar4,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals clamp_metrics(LO nmetrics, Reals metrics, Real h_min, Real h_max) {
  auto dim = get_metrics_dim(nmetrics, metrics);
  if (dim == 3) return clamp_metrics_dim<3>(nmetrics, metrics, h_min, h_max);
  if (dim == 2) return clamp_metrics_dim<2>(nmetrics, metrics, h_min, h_max);
  if (dim == 1) return clamp_metrics_dim<1>(nmetrics, metrics, h_min, h_max);
  OMEGA_H_NORETURN(Reals());
}